

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_Mesh.cpp
# Opt level: O0

void __thiscall
Nova::Simplex_Mesh<4>::Find_And_Append_Adjacent_Elements
          (Simplex_Mesh<4> *this,int simplex,Vector<int,_3,_true> *face)

{
  ulong uVar1;
  bool bVar2;
  int *piVar3;
  Array<int> *pAVar4;
  size_t sVar5;
  int local_3c;
  ulong uStack_38;
  int simplex2;
  size_t t;
  Vector<int,_2,_true> other_nodes;
  int first_node;
  Vector<int,_3,_true> *face_local;
  int simplex_local;
  Simplex_Mesh<4> *this_local;
  
  unique0x100000f6 = face;
  piVar3 = Vector<int,_3,_true>::operator()(face,0);
  other_nodes._data._M_elems[0] = *piVar3;
  Vector<int,_3,_true>::Remove_Index
            ((Vector<int,_3,_true> *)((long)&t + 4),(int)stack0xffffffffffffffe0);
  uStack_38 = 0;
  while( true ) {
    uVar1 = uStack_38;
    pAVar4 = Array<Nova::Array<int>_>::operator()
                       (this->incident_elements,other_nodes._data._M_elems[0]);
    sVar5 = Array<int>::size(pAVar4);
    if (sVar5 <= uVar1) break;
    pAVar4 = Array<Nova::Array<int>_>::operator()
                       (this->incident_elements,other_nodes._data._M_elems[0]);
    piVar3 = Array<int>::operator()(pAVar4,(int)uStack_38);
    local_3c = *piVar3;
    if ((local_3c != simplex) &&
       (bVar2 = Nodes_In_Simplex<2>(this,(Vector<int,_2,_true> *)((long)&t + 4),local_3c), bVar2)) {
      pAVar4 = Array<Nova::Array<int>_>::operator()(this->adjacent_elements,simplex);
      Array<int>::Append_Unique(pAVar4,&local_3c);
    }
    uStack_38 = uStack_38 + 1;
  }
  return;
}

Assistant:

void Nova::Simplex_Mesh<d>::
Find_And_Append_Adjacent_Elements(const int simplex,const Vector<int,d-1>& face)
{
    int first_node=face(0);Vector<int,d-2> other_nodes=face.Remove_Index(0);
    for(size_t t=0;t<(*incident_elements)(first_node).size();++t){
        int simplex2=(*incident_elements)(first_node)(t);
        if(simplex2!=simplex && Nodes_In_Simplex(other_nodes,simplex2))
            (*adjacent_elements)(simplex).Append_Unique(simplex2);}
}